

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  char *in_stack_00000070;
  char *in_stack_00000078;
  int local_4;
  
  if (in_EDI == 3) {
    iVar1 = strncmp(*(char **)(in_RSI + 8),"start",5);
    if (iVar1 == 0) {
      property_set(in_stack_00000078,in_stack_00000070);
    }
    else {
      iVar1 = strncmp(*(char **)(in_RSI + 8),"stop",4);
      if (iVar1 != 0) {
        fprintf(_stderr,"usage: service start/stop <svc>\n");
        return 1;
      }
      property_set(in_stack_00000078,in_stack_00000070);
    }
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"usage: service start/stop <svc>\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3) {
        fprintf(stderr,"usage: service start/stop <svc>\n");
        return 1;
    }


    if(strncmp(argv[1],"start", 5) == 0){
		    property_set("ctl.start", argv[2]);	
    } else if(strncmp(argv[1],"stop", 4) == 0){
		    property_set("ctl.stop", argv[2]);
    } else {
        fprintf(stderr,"usage: service start/stop <svc>\n");
        return 1;
    }
    return 0;
}